

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O2

void duckdb::ValidityRevertAppend(ColumnSegment *segment,idx_t start_row)

{
  BufferManager *pBVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  idx_t i;
  ulong uVar4;
  ulong uVar5;
  BufferHandle handle;
  ValidityMask mask;
  
  uVar4 = start_row - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pBVar1 = BufferManager::GetBufferManager(segment->db);
  (*pBVar1->_vptr_BufferManager[7])(&handle,pBVar1,&segment->block);
  if ((uVar4 & 7) != 0) {
    mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)BufferHandle::Ptr(&handle);
    uVar5 = (uVar4 & 0xfffffffffffffff8) + 8;
    mask.super_TemplatedValidityMask<unsigned_long>.capacity =
         (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
         super___atomic_base<unsigned_long>._M_i;
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
      if (mask.super_TemplatedValidityMask<unsigned_long>.validity_mask != (unsigned_long *)0x0) {
        mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] =
             mask.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] |
             1L << ((byte)uVar4 & 0x3f);
      }
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar4 = uVar5;
  }
  pdVar2 = BufferHandle::Ptr(&handle);
  iVar3 = ColumnSegment::SegmentSize(segment);
  switchD_016d4fed::default(pdVar2 + (uVar4 >> 3),0xff,iVar3 - (uVar4 >> 3));
  BufferHandle::~BufferHandle(&handle);
  return;
}

Assistant:

void ValidityRevertAppend(ColumnSegment &segment, idx_t start_row) {
	idx_t start_bit = start_row - segment.start;

	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);
	idx_t revert_start;
	if (start_bit % 8 != 0) {
		// handle sub-bit stuff (yay)
		idx_t byte_pos = start_bit / 8;
		idx_t bit_end = (byte_pos + 1) * 8;
		ValidityMask mask(reinterpret_cast<validity_t *>(handle.Ptr()), segment.count);
		for (idx_t i = start_bit; i < bit_end; i++) {
			mask.SetValid(i);
		}
		revert_start = bit_end / 8;
	} else {
		revert_start = start_bit / 8;
	}
	// for the rest, we just memset
	memset(handle.Ptr() + revert_start, 0xFF, segment.SegmentSize() - revert_start);
}